

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

InterfaceText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeInterfaceText
          (InterfaceText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr scope,StringPtr name,
          InterfaceSchema schema,Array<kj::StringTree> nestedTypeDecls,
          TemplateContext *templateContext)

{
  size_t sVar1;
  Reader proto_00;
  StringPtr hexId_00;
  size_t *psVar2;
  CapTableReader *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ArrayDisposer *pAVar6;
  Branch *pBVar7;
  size_type sVar8;
  int iVar9;
  StructSchema SVar10;
  size_type sVar11;
  char *pcVar12;
  _Rb_tree_node_base *p_Var13;
  RemoveConst<kj::StringTree> *pRVar14;
  size_t sVar15;
  ArrayBuilder<kj::StringTree> *__comp;
  StringTree *pSVar16;
  BrandInitializerText *pBVar17;
  char *pcVar18;
  Schema params_1;
  ExtendInfo *pEVar19;
  MethodText *pMVar20;
  CppTypeName *extraout_RDX;
  CppTypeName *extraout_RDX_00;
  CppTypeName *extraout_RDX_01;
  CppTypeName *pCVar21;
  CppTypeName *extraout_RDX_02;
  CppTypeName *extraout_RDX_03;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *map;
  StringTree *params;
  CappedArray<char,_17UL> *params_00;
  MethodText *pMVar22;
  char acVar23 [8];
  ExtendInfo *pEVar24;
  SegmentReader *pSVar25;
  StringTree *pSVar26;
  unsigned_long uVar27;
  CapnpcCppMain *this_00;
  StringPtr *params_2;
  char (*params_2_00) [9];
  long lVar28;
  long lVar29;
  TemplateContext *templateContext_00;
  uint uVar30;
  long lVar31;
  bool bVar32;
  StringPtr suffix;
  StringPtr name_00;
  StringPtr value;
  StringPtr name_01;
  StringPtr delim;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> content;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> content_00;
  Reader RVar33;
  StringPtr innerName;
  StringPtr innerName_00;
  StringPtr innerName_01;
  StringPtr innerName_02;
  StringPtr innerName_03;
  StringPtr innerName_04;
  initializer_list<kj::StringPtr> __l;
  StringPtr innerName_05;
  StringPtr type;
  StringPtr fullName_00;
  StringPtr suffix_00;
  StringPtr suffix_01;
  undefined4 uVar34;
  undefined4 uVar35;
  MethodText *pMVar36;
  uint16_t methodId;
  ExtendInfo *local_1068;
  ExtendInfo *local_1060;
  undefined1 local_1058 [16];
  Reader param;
  String fullName;
  InterfaceSchema schema_local;
  String titleCase;
  undefined1 local_fb8 [16];
  ArrayPtr<const_char> local_fa8;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [16];
  ArrayBuilder<kj::StringTree> builder_1;
  Array<kj::StringTree> local_f20;
  String implicitParamsTemplateDecl;
  undefined1 local_ee8 [24];
  undefined1 local_ed0 [16];
  undefined1 local_ec0 [16];
  String shortResultType;
  String shortParamType;
  StringPtr name_local;
  StringPtr name_1;
  undefined1 local_e60 [16];
  undefined1 local_e50 [24];
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> methods;
  String identifierName;
  ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> builder_3;
  Reader resultProto;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> superclasses;
  char *local_d68;
  undefined1 local_d60 [16];
  undefined1 local_d50 [16];
  StringTree local_d40;
  Reader paramProto;
  Array<capnp::(anonymous_namespace)::CppTypeName> implicitParams;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> transitiveSuperclasses;
  StructSchema resultSchema;
  char *local_c90;
  StructSchema paramSchema;
  ArrayDisposer *local_c80;
  IndexingIterator<const_capnp::InterfaceSchema::MethodList,_capnp::InterfaceSchema::Method>
  local_c78;
  StringTree requestMethodImpl;
  StringTree defineText;
  StringTree local_bd0;
  CappedArray<char,_8UL> local_b98;
  CappedArray<char,_8UL> local_b88;
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  CppTypeName genericParamType;
  ArrayPtr<const_char> local_b10;
  String templates;
  StringTree local_ab0;
  undefined1 local_a78 [16];
  SegmentReader *local_a68;
  Branch *pBStack_a60;
  Branch *local_a58;
  Impl *pIStack_a50;
  Branch *local_a48;
  size_type sStack_a40;
  CppTypeName resultType;
  StringTree declareText;
  CppTypeName clientName;
  Reader proto;
  ArrayPtr<const_char> local_930;
  char *local_920;
  ArrayDisposer *pAStack_918;
  Branch *local_910;
  Branch *pBStack_908;
  ArrayDisposer *local_900;
  CppTypeName genericResultType;
  char *local_8a0;
  Reader interfaceProto;
  Branch local_868;
  StringTree *local_828;
  long lStack_820;
  StringPtr scope_local;
  BrandInitializerText brandInitializers;
  undefined1 local_2c8 [16];
  Maybe<kj::_::Mutex::Waiter_&> local_2b8;
  Branch *pBStack_2b0;
  Branch *local_2a8;
  Impl *pIStack_2a0;
  Branch *local_298;
  size_type sStack_290;
  CappedArray<char,_17UL> hexId;
  Array<char> local_258;
  CppTypeName typeName;
  StringTree local_1d0;
  StringTree local_198;
  StringTree local_160;
  BrandInitializerText local_128;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  name_local.content.size_ = name.content.size_;
  pSVar26 = (StringTree *)name.content.ptr;
  scope_local.content.size_ = scope.content.size_;
  scope_local.content.ptr = scope.content.ptr;
  schema_local = schema;
  suffix.content.size_ = 1;
  suffix.content.ptr = "";
  name_local.content.ptr = (char *)pSVar26;
  TemplateContext::args(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_,suffix);
  kj::str<kj::StringPtr&,kj::StringPtr&,kj::StringTree>
            (&fullName,(kj *)&scope_local,&name_local,(StringPtr *)&brandInitializers,pSVar26);
  kj::StringTree::~StringTree(&brandInitializers.scopes);
  InterfaceSchema::getMethods((MethodList *)&local_930,&schema_local);
  local_868.content.branches.size_ = (size_t)local_900;
  local_868.content.text.content.disposer = (ArrayDisposer *)local_910;
  local_868.content.branches.ptr = pBStack_908;
  local_868.content.text.content.ptr = local_920;
  local_868.content.text.content.size_ = (size_t)pAStack_918;
  local_868.index = (size_t)local_930.ptr;
  local_868.content.size_ = local_930.size_;
  uVar30 = 0;
  pSVar26 = (StringTree *)0x0;
  templates.content.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (0x118,0,(ulong)local_910 & 0xffffffff,(_func_void_void_ptr *)0x0,
                          (_func_void_void_ptr *)0x0);
  templates.content.disposer =
       (ArrayDisposer *)(templates.content.ptr + ((ulong)local_910 & 0xffffffff) * 0x118);
  local_c78.container = (MethodList *)&local_868;
  templates.content.size_ = (size_t)templates.content.ptr;
  while( true ) {
    pSVar16 = &declareText;
    local_c78.index = uVar30;
    if (uVar30 == (uint)local_868.content.text.content.disposer) break;
    this_00 = (CapnpcCppMain *)local_2c8;
    _::IndexingIterator<const_capnp::InterfaceSchema::MethodList,_capnp::InterfaceSchema::Method>::
    operator*((Method *)this_00,&local_c78);
    __comp = (ArrayBuilder<kj::StringTree> *)0x240547;
    if (fullName.content.size_ != 0) {
      __comp = (ArrayBuilder<kj::StringTree> *)fullName.content.ptr;
    }
    local_a48 = local_298;
    pBVar7 = local_a48;
    sStack_a40 = sStack_290;
    sVar8 = sStack_a40;
    local_a58 = local_2a8;
    pIStack_a50 = pIStack_2a0;
    local_a68 = (SegmentReader *)local_2b8.ptr;
    pBStack_a60 = pBStack_2b0;
    local_a78._0_8_ = local_2c8._0_8_;
    local_a78._8_8_ = local_2c8._8_8_;
    local_d60._8_8_ = fullName.content.size_ + (fullName.content.size_ == 0);
    local_d60._0_8_ = __comp;
    proto._reader._32_8_ = local_298;
    proto._reader._40_8_ = sStack_290;
    proto._reader.data = local_2a8;
    proto._reader.pointers = (WirePointer *)pIStack_2a0;
    proto._reader.segment = (SegmentReader *)local_2b8.ptr;
    proto._reader.capTable = (CapTableReader *)pBStack_2b0;
    local_a48._0_4_ = (StructDataBitCount)local_298;
    local_a48._4_4_ = (undefined4)((ulong)local_298 >> 0x20);
    sStack_a40._0_4_ = (int)sStack_290;
    sStack_a40._4_4_ = (undefined4)(sStack_290 >> 0x20);
    proto_00._reader.capTable = (CapTableReader *)pBStack_2b0;
    proto_00._reader.segment = (SegmentReader *)local_2b8.ptr;
    proto_00._reader.data = local_2a8;
    proto_00._reader.pointers = (WirePointer *)pIStack_2a0;
    proto_00._reader.dataSize = (StructDataBitCount)local_a48;
    proto_00._reader.pointerCount = local_a48._4_2_;
    proto_00._reader._38_2_ = local_a48._6_2_;
    proto_00._reader.nestingLimit = (int)sStack_a40;
    proto_00._reader._44_4_ = sStack_a40._4_4_;
    local_a48 = pBVar7;
    sStack_a40 = sVar8;
    name_1 = protoName<capnp::schema::Method::Reader>(this_00,proto_00);
    name_00.content.ptr = (char *)name_1.content.size_;
    name_00.content.size_ = (size_t)__comp;
    toTitleCase(&titleCase,(CapnpcCppMain *)name_1.content.ptr,name_00);
    SVar10 = InterfaceSchema::Method::getParamType((Method *)local_a78);
    paramSchema.super_Schema.raw = SVar10.super_Schema.raw;
    SVar10 = InterfaceSchema::Method::getResultType((Method *)local_a78);
    resultSchema.super_Schema.raw = SVar10.super_Schema.raw;
    param._reader.segment = (SegmentReader *)name_1.content.ptr;
    param._reader.capTable = (CapTableReader *)name_1.content.size_;
    if (((anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords == '\0') &&
       (iVar9 = __cxa_guard_acquire(&(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords)
       , iVar9 != 0)) {
      brandInitializers.scopes.size_ = (size_t)anon_var_dwarf_7ced9;
      brandInitializers.scopes.text.content.ptr = (char *)0x8;
      brandInitializers.scopes.text.content.size_ = (size_t)anon_var_dwarf_7cee4;
      brandInitializers.scopes.branches.ptr = (Branch *)0x2536df;
      brandInitializers.scopes.branches.size_ = 4;
      brandInitializers.scopes.branches.disposer = (ArrayDisposer *)anon_var_dwarf_7cefa;
      brandInitializers.bindings.size_ = 7;
      brandInitializers.bindings.text.content.ptr = "asm";
      brandInitializers.bindings.text.content.disposer = (ArrayDisposer *)anon_var_dwarf_7cf10;
      brandInitializers.bindings.branches.ptr = (Branch *)0x5;
      brandInitializers.bindings.branches.size_ = (size_t)anon_var_dwarf_7cf1b;
      brandInitializers.dependencies.size_ = (size_t)anon_var_dwarf_7cf26;
      brandInitializers.dependencies.text.content.ptr = (char *)0x6;
      brandInitializers.dependencies.text.content.size_ = (size_t)anon_var_dwarf_7bd0c;
      brandInitializers.dependencies.branches.ptr = (Branch *)anon_var_dwarf_7cf31;
      brandInitializers.dependencies.branches.disposer = (ArrayDisposer *)0x24b71c;
      __comp = &builder_1;
      __l._M_len = 0x54;
      __l._M_array = (iterator)&brandInitializers;
      brandInitializers.scopes.text.content.disposer =
           (ArrayDisposer *)brandInitializers.scopes.text.content.ptr;
      brandInitializers.bindings.text.content.size_ = brandInitializers.scopes.branches.size_;
      brandInitializers.bindings.branches.disposer =
           (ArrayDisposer *)brandInitializers.bindings.size_;
      brandInitializers.dependencies.text.content.disposer =
           (ArrayDisposer *)brandInitializers.bindings.branches.ptr;
      brandInitializers.dependencies.branches.size_ =
           (size_t)brandInitializers.dependencies.text.content.ptr;
      brandInitializers.dependencyCount = (size_t)brandInitializers.bindings.branches.ptr;
      std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::set
                ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                 (anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,__l,
                 (less<kj::StringPtr> *)__comp,(allocator_type *)pSVar16);
      __cxa_atexit(std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
                   ::~set,(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords);
      pSVar26 = pSVar16;
    }
    sVar11 = std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::
             count((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                   (anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,(key_type *)&param
                  );
    if (sVar11 == 0) {
      value.content.size_ = (size_t)__comp;
      value.content.ptr = (char *)param._reader.capTable;
      kj::heapString(&identifierName,(kj *)param._reader.segment,value);
    }
    else {
      brandInitializers.scopes.size_ = CONCAT71(brandInitializers.scopes.size_._1_7_,0x5f);
      kj::str<kj::StringPtr&,char>
                (&identifierName,(kj *)&param,(StringPtr *)&brandInitializers,(char *)__comp);
    }
    Schema::getProto(&paramProto,&paramSchema.super_Schema);
    Schema::getProto(&resultProto,&resultSchema.super_Schema);
    capnp::schema::Method::Reader::getImplicitParameters((Reader *)&hexId,(Reader *)&proto);
    kj::heapArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&superclasses,
               (ulong)(uint)hexId._24_4_);
    uVar34 = hexId._24_4_;
    builder_1.ptr = (StringTree *)&hexId;
    builder_1.pos = (RemoveConst<kj::StringTree> *)((ulong)builder_1.pos & 0xffffffff00000000);
    iVar9 = 0;
    while (sVar1 = superclasses.size_, pEVar19 = superclasses.ptr, iVar9 != uVar34) {
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
      ::operator*(&param,(IndexingIterator<const_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_capnp::schema::Node::Parameter::Reader>
                          *)&builder_1);
      RVar33 = capnp::schema::Node::Parameter::Reader::getName(&param);
      name_01.content.ptr = RVar33.super_StringPtr.content.size_;
      name_01.content.size_ = (size_t)__comp;
      CppTypeName::makeTemplateParam
                ((CppTypeName *)&brandInitializers,RVar33.super_StringPtr.content.ptr,name_01);
      sVar1 = superclasses.size_;
      CppTypeName::CppTypeName((CppTypeName *)superclasses.size_,(CppTypeName *)&brandInitializers);
      superclasses.size_ = sVar1 + 0x40;
      kj::StringTree::~StringTree(&brandInitializers.scopes);
      iVar9 = (int)builder_1.pos + 1;
      builder_1.pos = (RemoveConst<kj::StringTree> *)CONCAT44(builder_1.pos._4_4_,iVar9);
    }
    local_1068 = (ExtendInfo *)((long)(superclasses.size_ - (long)superclasses.ptr) >> 6);
    implicitParams.ptr = &(superclasses.ptr)->typeName;
    superclasses.disposer = (ArrayDisposer *)0x0;
    implicitParamsTemplateDecl.content.disposer = (ArrayDisposer *)0x0;
    superclasses.ptr = (ExtendInfo *)0x0;
    superclasses.size_ = 0;
    implicitParamsTemplateDecl.content.ptr = (char *)0x0;
    implicitParamsTemplateDecl.content.size_ = 0;
    implicitParams.size_ = (size_t)local_1068;
    if ((ExtendInfo *)sVar1 != pEVar19) {
      builder_1.ptr =
           kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>((size_t)local_1068);
      pSVar16 = builder_1.ptr + (long)local_1068;
      builder_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      builder_1.pos = builder_1.ptr;
      builder_1.endPtr = pSVar16;
      for (pEVar24 = pEVar19; pEVar24 != (ExtendInfo *)sVar1; pEVar24 = (ExtendInfo *)&pEVar24->id)
      {
        resultType.name._0_16_ = kj::toCharSequence<char_const(&)[10]>((char (*) [10])0x24193e);
        kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                  ((String *)&declareText,(kj *)pEVar24,resultType.name.text.content.ptr);
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::String>
                  (&brandInitializers.scopes,&resultType.name,(ArrayPtr<const_char> *)&declareText,
                   (String *)pSVar16);
        kj::Array<char>::~Array((Array<char> *)&declareText);
        kj::StringTree::StringTree(builder_1.pos,&brandInitializers.scopes);
        builder_1.pos = builder_1.pos + 1;
        kj::StringTree::~StringTree(&brandInitializers.scopes);
      }
      genericParamType.name.text.content.ptr =
           (char *)(((long)builder_1.pos - (long)builder_1.ptr) / 0x38);
      genericParamType.name.size_ = (size_t)builder_1.ptr;
      genericParamType.name.text.content.size_ = (size_t)builder_1.disposer;
      builder_1.ptr = (StringTree *)0x0;
      builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
      builder_1.endPtr = (StringTree *)0x0;
      kj::ArrayBuilder<kj::StringTree>::dispose(&builder_1);
      delim.content.size_ = 3;
      delim.content.ptr = ", ";
      kj::StringTree::StringTree
                ((StringTree *)&param,(Array<kj::StringTree> *)&genericParamType,delim);
      kj::str<char_const(&)[11],kj::StringTree,char_const(&)[3]>
                ((String *)&defineText,(kj *)"template <",(char (*) [11])&param,
                 (StringTree *)0x23fa79,(char (*) [3])pSVar26);
      kj::Array<char>::operator=(&implicitParamsTemplateDecl.content,(Array<char> *)&defineText);
      kj::Array<char>::~Array((Array<char> *)&defineText);
      kj::StringTree::~StringTree((StringTree *)&param);
      kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&genericParamType);
    }
    brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
    pBVar17 = &brandInitializers;
    cppFullName((CppTypeName *)&declareText,this,(Schema)local_a78._0_8_,
                (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
    defineText.branches.disposer._0_4_ = 0;
    stack0xfffffffffffff40c = 0;
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_._0_4_ = 0;
    defineText.branches.size_._4_4_ = 0;
    defineText.text.content.size_ = 0;
    defineText.text.content.disposer = (ArrayDisposer *)0x0;
    defineText.size_ = 0;
    defineText.text.content.ptr = (char *)0x0;
    genericParamType.name.branches.disposer._0_4_ = 0;
    genericParamType._52_8_ = 0;
    genericParamType.name.branches.ptr = (Branch *)0x0;
    genericParamType.name.branches.size_._0_4_ = 0;
    genericParamType.name.branches.size_._4_4_ = 0;
    genericParamType.name.text.content.size_ = 0;
    genericParamType.name.text.content.disposer = (ArrayDisposer *)0x0;
    genericParamType.name.size_ = 0;
    genericParamType.name.text.content.ptr = (char *)0x0;
    if ((paramProto._reader.dataSize < 0xc0) ||
       (*(long *)((long)paramProto._reader.data + 0x10) == 0)) {
      CppTypeName::operator=((CppTypeName *)&defineText,(CppTypeName *)&declareText);
      if ((ExtendInfo *)sVar1 == pEVar19) {
        kj::str<kj::String&,char_const(&)[7]>
                  ((String *)&param,(kj *)&titleCase,(String *)"Params",(char (*) [7])pBVar17);
        pSVar25 = (SegmentReader *)0x240547;
        if (param._reader.capTable != (CapTableReader *)0x0) {
          pSVar25 = param._reader.segment;
        }
        innerName_01.content.size_ =
             (long)&(param._reader.capTable)->_vptr_CapTableReader +
             (ulong)(param._reader.capTable == (CapTableReader *)0x0);
        innerName_01.content.ptr = (char *)pSVar25;
        CppTypeName::addMemberType((CppTypeName *)&defineText,innerName_01);
        kj::Array<char>::~Array((Array<char> *)&param);
        CppTypeName::operator=(&genericParamType,(CppTypeName *)&defineText);
      }
      else {
        CppTypeName::operator=(&genericParamType,(CppTypeName *)&defineText);
        kj::str<kj::String&,char_const(&)[7]>
                  ((String *)&param,(kj *)&titleCase,(String *)"Params",(char (*) [7])pBVar17);
        pSVar25 = (SegmentReader *)0x240547;
        if (param._reader.capTable != (CapTableReader *)0x0) {
          pSVar25 = param._reader.segment;
        }
        innerName.content.size_ =
             (long)&(param._reader.capTable)->_vptr_CapTableReader +
             (ulong)(param._reader.capTable == (CapTableReader *)0x0);
        builder_1.ptr = (StringTree *)0x0;
        builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
        builder_1.endPtr = (StringTree *)0x0;
        innerName.content.ptr = (char *)pSVar25;
        pBVar17 = (BrandInitializerText *)&builder_1;
        CppTypeName::addMemberTemplate
                  (&genericParamType,innerName,
                   (Array<capnp::(anonymous_namespace)::CppTypeName> *)&builder_1);
        kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array
                  ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&builder_1);
        kj::Array<char>::~Array((Array<char> *)&param);
        kj::str<kj::String&,char_const(&)[7]>
                  ((String *)&param,(kj *)&titleCase,(String *)"Params",(char (*) [7])pBVar17);
        pCVar3 = param._reader.capTable;
        pSVar25 = param._reader.segment;
        content.size_ = (size_t)pBVar17;
        content.ptr = &local_1068->typeName;
        kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>
                  ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&builder_1,(kj *)pEVar19,
                   content);
        innerName_00.content.size_ =
             (long)&pCVar3->_vptr_CapTableReader + (ulong)(pCVar3 == (CapTableReader *)0x0);
        if (pCVar3 == (CapTableReader *)0x0) {
          pSVar25 = (SegmentReader *)0x240547;
        }
        innerName_00.content.ptr = (char *)pSVar25;
        pBVar17 = (BrandInitializerText *)&builder_1;
        CppTypeName::addMemberTemplate
                  ((CppTypeName *)&defineText,innerName_00,
                   (Array<capnp::(anonymous_namespace)::CppTypeName> *)&builder_1);
        kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array
                  ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&builder_1);
        kj::Array<char>::~Array((Array<char> *)&param);
      }
    }
    else {
      clientName.name.size_ = CONCAT71(clientName.name.size_._1_7_,1);
      clientName._56_8_ = local_a48;
      clientName.name.branches.size_ = (size_t)local_a58;
      clientName.name.branches.disposer = (ArrayDisposer *)pIStack_a50;
      clientName.name.text.content.disposer = (ArrayDisposer *)local_a68;
      clientName.name.branches.ptr = pBStack_a60;
      clientName.name.text.content.ptr = (char *)local_a78._0_8_;
      clientName.name.text.content.size_ = local_a78._8_8_;
      pBVar17 = (BrandInitializerText *)&param;
      cppFullName((CppTypeName *)pBVar17,this,paramSchema.super_Schema.raw,
                  (Maybe<capnp::InterfaceSchema::Method> *)&clientName);
      CppTypeName::operator=((CppTypeName *)&defineText,(CppTypeName *)pBVar17);
      kj::StringTree::~StringTree((StringTree *)pBVar17);
      param._reader.segment = (SegmentReader *)((ulong)param._reader.segment & 0xffffffffffffff00);
      cppFullName((CppTypeName *)&builder_1,this,paramSchema.super_Schema.raw,
                  (Maybe<capnp::InterfaceSchema::Method> *)pBVar17);
      CppTypeName::operator=(&genericParamType,(CppTypeName *)&builder_1);
      kj::StringTree::~StringTree((StringTree *)&builder_1);
    }
    resultType.name.branches.disposer._0_4_ = 0;
    resultType._52_8_ = 0;
    resultType.name.branches.ptr = (Branch *)0x0;
    resultType.name.branches.size_._0_4_ = 0;
    resultType.name.branches.size_._4_4_ = 0;
    resultType.name.text.content.size_ = 0;
    resultType.name.text.content.disposer = (ArrayDisposer *)0x0;
    resultType.name._0_16_ = ZEXT816(0);
    genericResultType.name.branches.disposer._0_4_ = 0;
    genericResultType._52_8_ = 0;
    genericResultType.name.branches.ptr = (Branch *)0x0;
    genericResultType.name.branches.size_._0_4_ = 0;
    genericResultType.name.branches.size_._4_4_ = 0;
    genericResultType.name.text.content.size_ = 0;
    genericResultType.name.text.content.disposer = (ArrayDisposer *)0x0;
    genericResultType.name.size_ = 0;
    genericResultType.name.text.content.ptr = (char *)0x0;
    local_1060 = (ExtendInfo *)sVar1;
    if ((resultProto._reader.dataSize < 0xc0) ||
       (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
      CppTypeName::operator=(&resultType,(CppTypeName *)&declareText);
      if ((ExtendInfo *)sVar1 == pEVar19) {
        kj::str<kj::String&,char_const(&)[8]>
                  ((String *)&builder_1,(kj *)&titleCase,(String *)"Results",(char (*) [8])pBVar17);
        pSVar26 = (StringTree *)0x240547;
        if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
          pSVar26 = builder_1.ptr;
        }
        innerName_04.content.size_ =
             (long)&(builder_1.pos)->size_ +
             (ulong)(builder_1.pos == (RemoveConst<kj::StringTree> *)0x0);
        innerName_04.content.ptr = (char *)pSVar26;
        CppTypeName::addMemberType(&resultType,innerName_04);
        kj::Array<char>::~Array((Array<char> *)&builder_1);
        CppTypeName::operator=(&genericResultType,&resultType);
        pCVar21 = extraout_RDX_01;
      }
      else {
        CppTypeName::operator=(&genericResultType,&resultType);
        kj::str<kj::String&,char_const(&)[8]>
                  ((String *)&builder_1,(kj *)&titleCase,(String *)"Results",(char (*) [8])pBVar17);
        pSVar26 = (StringTree *)0x240547;
        if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
          pSVar26 = builder_1.ptr;
        }
        innerName_02.content.size_ =
             (long)&(builder_1.pos)->size_ +
             (ulong)(builder_1.pos == (RemoveConst<kj::StringTree> *)0x0);
        requestMethodImpl.size_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        requestMethodImpl.text.content.size_ = 0;
        innerName_02.content.ptr = (char *)pSVar26;
        pBVar17 = (BrandInitializerText *)&requestMethodImpl;
        CppTypeName::addMemberTemplate
                  (&genericResultType,innerName_02,
                   (Array<capnp::(anonymous_namespace)::CppTypeName> *)&requestMethodImpl);
        kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array
                  ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&requestMethodImpl);
        kj::Array<char>::~Array((Array<char> *)&builder_1);
        kj::str<kj::String&,char_const(&)[8]>
                  ((String *)&builder_1,(kj *)&titleCase,(String *)"Results",(char (*) [8])pBVar17);
        pRVar14 = builder_1.pos;
        pSVar26 = builder_1.ptr;
        content_00.size_ = (size_t)pBVar17;
        content_00.ptr = &local_1068->typeName;
        kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>
                  ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&requestMethodImpl,
                   (kj *)pEVar19,content_00);
        innerName_03.content.size_ =
             (long)&pRVar14->size_ + (ulong)(pRVar14 == (RemoveConst<kj::StringTree> *)0x0);
        if (pRVar14 == (RemoveConst<kj::StringTree> *)0x0) {
          pSVar26 = (StringTree *)0x240547;
        }
        innerName_03.content.ptr = (char *)pSVar26;
        pBVar17 = (BrandInitializerText *)&requestMethodImpl;
        CppTypeName::addMemberTemplate
                  (&resultType,innerName_03,
                   (Array<capnp::(anonymous_namespace)::CppTypeName> *)&requestMethodImpl);
        kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array
                  ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&requestMethodImpl);
        kj::Array<char>::~Array((Array<char> *)&builder_1);
        pCVar21 = extraout_RDX_00;
      }
    }
    else {
      builder_3.ptr = (ExtendInfo *)CONCAT71(builder_3.ptr._1_7_,1);
      builder_3.disposer = (ArrayDisposer *)local_a68;
      builder_3.pos =
           (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)local_a78._0_8_;
      builder_3.endPtr = (ExtendInfo *)local_a78._8_8_;
      pBVar17 = (BrandInitializerText *)&builder_1;
      cppFullName((CppTypeName *)pBVar17,this,resultSchema.super_Schema.raw,
                  (Maybe<capnp::InterfaceSchema::Method> *)&builder_3);
      CppTypeName::operator=(&resultType,(CppTypeName *)pBVar17);
      kj::StringTree::~StringTree((StringTree *)pBVar17);
      builder_1.ptr = (StringTree *)((ulong)builder_1.ptr & 0xffffffffffffff00);
      cppFullName((CppTypeName *)&requestMethodImpl,this,resultSchema.super_Schema.raw,
                  (Maybe<capnp::InterfaceSchema::Method> *)pBVar17);
      CppTypeName::operator=(&genericResultType,(CppTypeName *)&requestMethodImpl);
      kj::StringTree::~StringTree(&requestMethodImpl);
      pCVar21 = extraout_RDX;
    }
    if ((paramProto._reader.dataSize < 0xc0) ||
       (*(long *)((long)paramProto._reader.data + 0x10) == 0)) {
      kj::str<kj::String&,char_const(&)[7]>
                (&shortParamType,(kj *)&titleCase,(String *)"Params",(char (*) [7])pBVar17);
      pCVar21 = extraout_RDX_03;
    }
    else {
      kj::str<capnp::(anonymous_namespace)::CppTypeName&>
                (&shortParamType,(kj *)&genericParamType,pCVar21);
      pCVar21 = extraout_RDX_02;
    }
    if ((resultProto._reader.dataSize < 0xc0) ||
       (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
      kj::str<kj::String&,char_const(&)[8]>
                (&shortResultType,(kj *)&titleCase,(String *)"Results",(char (*) [8])pBVar17);
    }
    else {
      kj::str<capnp::(anonymous_namespace)::CppTypeName&>
                (&shortResultType,(kj *)&genericResultType,pCVar21);
    }
    requestMethodImpl.size_ = local_a78._0_8_;
    Schema::getProto(&interfaceProto,(Schema *)&requestMethodImpl);
    if (interfaceProto._reader.dataSize < 0x40) {
      uVar27 = 0;
    }
    else {
      uVar27 = *interfaceProto._reader.data;
    }
    kj::hex((CappedArray<char,_17UL> *)&transitiveSuperclasses,uVar27);
    methodId = local_a78._8_2_;
    TemplateContext::allDecls(&local_ab0,(TemplateContext *)nestedTypeDecls.size_);
    if (*(uint *)(nestedTypeDecls.size_ + 0x38) < 0x121) {
      local_d68 = "";
      local_8a0 = "\n";
    }
    else {
      bVar32 = (*(byte *)(*(long *)(nestedTypeDecls.size_ + 0x28) + 0x24) & 1) == 0;
      local_d68 = "CAPNP_AUTO_IF_MSVC(";
      if (bVar32) {
        local_d68 = "";
      }
      local_8a0 = ")\n";
      if (bVar32) {
        local_8a0 = "\n";
      }
    }
    local_ee8._0_8_ = implicitParamsTemplateDecl.content.size_;
    if (implicitParamsTemplateDecl.content.size_ != 0) {
      local_ee8._0_8_ = implicitParamsTemplateDecl.content.ptr;
    }
    local_ee8._8_8_ = 0;
    if (implicitParamsTemplateDecl.content.size_ != 0) {
      local_ee8._8_8_ = implicitParamsTemplateDecl.content.size_ - 1;
    }
    local_1058 = (undefined1  [16])kj::toCharSequence<char_const*>(&local_d68);
    local_f78 = (undefined1  [16])
                kj::toCharSequence<char_const(&)[18]>((char (*) [18])"::capnp::Request<");
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_bd0,(kj *)&defineText,local_f78._8_8_);
    local_f88 = (undefined1  [16])kj::toCharSequence<char_const(&)[3]>((char (*) [3])0x241176);
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_d40,(kj *)&resultType,(CppTypeName *)local_f88._8_8_);
    local_f98 = (undefined1  [16])kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x24ae2a);
    local_fa8 = kj::toCharSequence<char_const*>(&local_8a0);
    local_fb8._8_8_ = (char *)(local_d60._8_8_ + -1);
    local_fb8._0_8_ = local_d60._0_8_;
    local_ec0 = (undefined1  [16])kj::toCharSequence<char_const(&)[11]>((char (*) [11])"::Client::")
    ;
    local_ed0._8_8_ = name_1.content.size_ - 1;
    local_ed0._0_8_ = name_1.content.ptr;
    local_e50._0_16_ =
         (undefined1  [16])
         kj::toCharSequence<char_const(&)[73]>
                   ((char (*) [73])
                    "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n  return newCall<");
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_b10,(kj *)&defineText,local_e50._8_8_);
    local_e60 = (undefined1  [16])kj::toCharSequence<char_const(&)[3]>((char (*) [3])0x241176);
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_f20,(kj *)&resultType,local_e60._8_8_);
    local_d50 = (undefined1  [16])
                kj::toCharSequence<char_const(&)[12]>((char (*) [12])">(\n      0x");
    local_b68._8_8_ = transitiveSuperclasses.ptr;
    local_b68._0_8_ = &transitiveSuperclasses.size_;
    local_b78 = (undefined1  [16])kj::toCharSequence<char_const(&)[6]>((char (*) [6])"ull, ");
    local_1068 = pEVar19;
    local_b88 = kj::toCharSequence<unsigned_short&>(&methodId);
    local_b98 = (CappedArray<char,_8UL>)
                kj::toCharSequence<char_const(&)[16]>((char (*) [16])", sizeHint);\n}\n");
    kj::StringTree::
    concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
              (&requestMethodImpl,&local_ab0,(StringTree *)local_ee8,
               (ArrayPtr<const_char> *)local_1058,(ArrayPtr<const_char> *)local_f78,
               (ArrayPtr<const_char> *)&local_bd0,(String *)local_f88,
               (ArrayPtr<const_char> *)&local_d40,(String *)local_f98,&local_fa8,
               (ArrayPtr<const_char> *)local_fb8,(ArrayPtr<const_char> *)local_ec0,
               (ArrayPtr<const_char> *)local_ed0,(ArrayPtr<const_char> *)local_e50,&local_b10,
               (String *)local_e60,(ArrayPtr<const_char> *)&local_f20,(String *)local_d50,
               (ArrayPtr<const_char> *)local_b68,(ArrayPtr<const_char> *)local_b78,
               (ArrayPtr<const_char> *)&local_b88,&local_b98,(ArrayPtr<const_char> *)this);
    kj::Array<char>::~Array((Array<char> *)&local_f20);
    kj::Array<char>::~Array((Array<char> *)&local_b10);
    kj::Array<char>::~Array((Array<char> *)&local_d40);
    kj::Array<char>::~Array((Array<char> *)&local_bd0);
    kj::StringTree::~StringTree(&local_ab0);
    pcVar12 = "  ";
    if (implicitParamsTemplateDecl.content.size_ < 2) {
      pcVar12 = "";
    }
    local_e50._0_8_ = pcVar12;
    if (*(uint *)(nestedTypeDecls.size_ + 0x38) < 0x121) {
      pcVar12 = "  ";
      pcVar18 = "";
    }
    else {
      bVar32 = (*(byte *)(*(long *)(nestedTypeDecls.size_ + 0x28) + 0x24) & 1) == 0;
      pcVar12 = "  CAPNP_AUTO_IF_MSVC(";
      if (bVar32) {
        pcVar12 = "  ";
      }
      pcVar18 = ")";
      if (bVar32) {
        pcVar18 = "";
      }
    }
    local_e60._0_8_ = pcVar12;
    local_d50._0_8_ = pcVar18;
    local_d40._0_16_ = kj::toCharSequence<char_const*>((char **)local_e50);
    local_b10.ptr = (char *)implicitParamsTemplateDecl.content.size_;
    if (implicitParamsTemplateDecl.content.size_ != 0) {
      local_b10.ptr = implicitParamsTemplateDecl.content.ptr;
    }
    local_b10.size_ = 0;
    if (implicitParamsTemplateDecl.content.size_ != 0) {
      local_b10.size_ = implicitParamsTemplateDecl.content.size_ - 1;
    }
    local_f20._0_16_ = kj::toCharSequence<char_const*>((char **)local_e60);
    local_ee8._0_16_ =
         (undefined1  [16])kj::toCharSequence<char_const(&)[18]>((char (*) [18])"::capnp::Request<")
    ;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_ab0,(kj *)&defineText,local_ee8._8_8_);
    local_1058 = (undefined1  [16])kj::toCharSequence<char_const(&)[3]>((char (*) [3])0x241176);
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_bd0,(kj *)&resultType,local_1058._8_8_);
    local_f78 = (undefined1  [16])kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x24ae2a);
    local_f88 = (undefined1  [16])kj::toCharSequence<char_const*>((char **)local_d50);
    local_f98 = (undefined1  [16])kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x23fc45);
    local_fa8.size_ = name_1.content.size_ - 1;
    local_fa8.ptr = name_1.content.ptr;
    uVar34 = 0x18c464;
    uVar35 = 0;
    local_fb8 = (undefined1  [16])
                kj::toCharSequence<char_const(&)[72]>
                          ((char (*) [72])
                           "Request(\n      ::kj::Maybe< ::capnp::MessageSize> sizeHint = nullptr);\n"
                          );
    kj::StringTree::
    concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&typeName.name,&local_d40,&local_b10,(ArrayPtr<const_char> *)&local_f20,
               (ArrayPtr<const_char> *)local_ee8,(ArrayPtr<const_char> *)&local_ab0,
               (String *)local_1058,(ArrayPtr<const_char> *)&local_bd0,(String *)local_f78,
               (ArrayPtr<const_char> *)local_f88,(ArrayPtr<const_char> *)local_f98,&local_fa8,
               (ArrayPtr<const_char> *)local_fb8,(ArrayPtr<const_char> *)CONCAT44(uVar35,uVar34));
    kj::Array<char>::~Array((Array<char> *)&local_bd0);
    kj::Array<char>::~Array((Array<char> *)&local_ab0);
    if ((paramProto._reader.dataSize < 0xc0) ||
       (*(long *)((long)paramProto._reader.data + 0x10) == 0)) {
      local_d40._0_16_ = kj::toCharSequence<char_const(&)[11]>((char (*) [11])0x241d50);
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&local_bd0,(kj *)&genericParamType,local_d40.text.content.ptr);
      local_b10 = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x23fc45);
      local_f20.ptr = (StringTree *)titleCase.content.size_;
      if (titleCase.content.size_ != 0) {
        local_f20.ptr = (StringTree *)titleCase.content.ptr;
      }
      local_f20.size_ = 0;
      if (titleCase.content.size_ != 0) {
        local_f20.size_ = titleCase.content.size_ - 1;
      }
      local_ee8._0_16_ =
           (undefined1  [16])kj::toCharSequence<char_const(&)[9]>((char (*) [9])"Params;\n");
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                (&local_ab0,&local_d40,(ArrayPtr<const_char> *)&local_bd0,(String *)&local_b10,
                 (ArrayPtr<const_char> *)&local_f20,(ArrayPtr<const_char> *)local_ee8,
                 (ArrayPtr<const_char> *)this);
      kj::Array<char>::~Array((Array<char> *)&local_bd0);
    }
    else {
      kj::StringTree::concat<>();
    }
    if ((resultProto._reader.dataSize < 0xc0) ||
       (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
      local_b10 = kj::toCharSequence<char_const(&)[11]>((char (*) [11])0x241d50);
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&local_d40,(kj *)&genericResultType,(CppTypeName *)local_b10.size_);
      local_f20._0_16_ = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x23fc45);
      local_ee8._0_8_ = titleCase.content.size_;
      if (titleCase.content.size_ != 0) {
        local_ee8._0_8_ = titleCase.content.ptr;
      }
      local_ee8._8_8_ = 0;
      if (titleCase.content.size_ != 0) {
        local_ee8._8_8_ = titleCase.content.size_ - 1;
      }
      local_1058 = (undefined1  [16])
                   kj::toCharSequence<char_const(&)[10]>((char (*) [10])"Results;\n");
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                (&local_bd0,(StringTree *)&local_b10,(ArrayPtr<const_char> *)&local_d40,
                 (String *)&local_f20,(ArrayPtr<const_char> *)local_ee8,
                 (ArrayPtr<const_char> *)local_1058,(ArrayPtr<const_char> *)this);
      kj::Array<char>::~Array((Array<char> *)&local_d40);
    }
    else {
      kj::StringTree::concat<>();
    }
    kj::
    strTree<kj::StringTree,kj::StringTree,char_const(&)[32],kj::String&,char_const(&)[3],kj::String&,char_const(&)[3],kj::String&,char_const(&)[40],kj::String&,char_const(&)[2],kj::String&,char_const(&)[19]>
              ((StringTree *)&typeName.isArgDependent,(kj *)&local_ab0,&local_bd0,
               (StringTree *)"  typedef ::capnp::CallContext<",(char (*) [32])&shortParamType,
               (String *)0x241176,(char (*) [3])&shortResultType,(String *)0x240ef1,
               (char (*) [3])&titleCase,(String *)"Context;\n  virtual ::kj::Promise<void> ",
               (char (*) [40])&identifierName,(String *)0x242fe5,(char (*) [2])&titleCase,
               (String *)"Context context);\n",(char (*) [19])this);
    if (local_1060 == local_1068) {
      kj::StringTree::concat<>();
      local_d40.text.content.ptr = requestMethodImpl.text.content.ptr;
      local_d40.size_ = requestMethodImpl.size_;
      local_d40.text.content.size_ = requestMethodImpl.text.content.size_;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      requestMethodImpl.text.content.size_ = 0;
      local_d40.text.content.disposer = requestMethodImpl.text.content.disposer;
      local_d40.branches.ptr = requestMethodImpl.branches.ptr;
      local_d40.branches.size_ = requestMethodImpl.branches.size_;
      local_d40.branches.disposer = requestMethodImpl.branches.disposer;
      requestMethodImpl.branches.ptr = (Branch *)0x0;
      requestMethodImpl.branches.size_ = 0;
    }
    else {
      local_1d0.size_ = requestMethodImpl.size_;
      local_1d0.text.content.ptr = requestMethodImpl.text.content.ptr;
      local_1d0.text.content.size_ = requestMethodImpl.text.content.size_;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      requestMethodImpl.text.content.size_ = 0;
      local_1d0.text.content.disposer = requestMethodImpl.text.content.disposer;
      local_1d0.branches.ptr = requestMethodImpl.branches.ptr;
      local_1d0.branches.size_ = requestMethodImpl.branches.size_;
      local_1d0.branches.disposer = requestMethodImpl.branches.disposer;
      requestMethodImpl.branches.ptr = (Branch *)0x0;
      requestMethodImpl.branches.size_ = 0;
      kj::StringTree::concat<>();
    }
    TemplateContext::allDecls((StringTree *)&local_b10,(TemplateContext *)nestedTypeDecls.size_);
    local_ed0 = (undefined1  [16])capnp::schema::Node::Reader::getDisplayName(&interfaceProto);
    kj::
    strTree<kj::StringTree,kj::StringTree,char_const(&)[21],kj::StringPtr&,char_const(&)[11],kj::String&,char_const(&)[2],kj::String&,char_const(&)[80],capnp::Text::Reader,char_const(&)[5],kj::StringPtr&,char_const(&)[12],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[6]>
              (&local_198,(kj *)&local_d40,(StringTree *)&local_b10,(StringTree *)0x242b3e,
               (char (*) [21])local_d60,(StringPtr *)"::Server::",(char (*) [11])&identifierName,
               (String *)0x242fe5,(char (*) [2])&titleCase,
               (String *)
               "Context) {\n  return ::capnp::Capability::Server::internalUnimplemented(\n      \"",
               (char (*) [80])local_ed0,(Reader *)"\", \"",(char (*) [5])&name_1,
               (StringPtr *)"\",\n      0x",(char (*) [12])&transitiveSuperclasses,
               (CappedArray<char,_17UL> *)"ull, ",(char (*) [6])&methodId,(unsigned_short *)0x240847
               ,(char (*) [6])this);
    local_1058 = (undefined1  [16])kj::toCharSequence<char_const(&)[10]>((char (*) [10])"    case ")
    ;
    local_f78 = (undefined1  [16])kj::toCharSequence<unsigned_short&>(&methodId);
    local_f88 = (undefined1  [16])kj::toCharSequence<char_const(&)[16]>((char (*) [16])0x242e63);
    local_f98._0_8_ = identifierName.content.size_;
    if (identifierName.content.size_ != 0) {
      local_f98._0_8_ = identifierName.content.ptr;
    }
    local_f98._8_8_ = 0;
    if (identifierName.content.size_ != 0) {
      local_f98._8_8_ = identifierName.content.size_ - 1;
    }
    local_fa8 = kj::toCharSequence<char_const(&)[66]>
                          ((char (*) [66])
                           "(::capnp::Capability::Server::internalGetTypedContext<\n          ");
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_f20,(kj *)&genericParamType,(CppTypeName *)local_fa8.size_);
    local_fb8 = (undefined1  [16])kj::toCharSequence<char_const(&)[3]>((char (*) [3])0x241176);
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)local_ee8,(kj *)&genericResultType,local_fb8._8_8_);
    local_ec0 = (undefined1  [16])
                kj::toCharSequence<char_const(&)[14]>((char (*) [14])">(context));\n");
    pSVar26 = (StringTree *)local_f98;
    kj::StringTree::
    concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
              (&local_160,(StringTree *)local_1058,(ArrayPtr<const_char> *)local_f78,
               (CappedArray<char,_8UL> *)local_f88,(ArrayPtr<const_char> *)pSVar26,&local_fa8,
               (ArrayPtr<const_char> *)&local_f20,(String *)local_fb8,
               (ArrayPtr<const_char> *)local_ee8,(String *)local_ec0,(ArrayPtr<const_char> *)this);
    kj::Array<char>::~Array((Array<char> *)local_ee8);
    kj::Array<char>::~Array((Array<char> *)&local_f20);
    kj::StringTree::~StringTree((StringTree *)&local_b10);
    kj::StringTree::~StringTree(&local_d40);
    kj::StringTree::~StringTree(&local_bd0);
    kj::StringTree::~StringTree(&local_ab0);
    kj::StringTree::~StringTree(&requestMethodImpl);
    kj::Array<char>::~Array(&shortResultType.content);
    kj::Array<char>::~Array(&shortParamType.content);
    kj::StringTree::~StringTree(&genericResultType.name);
    kj::StringTree::~StringTree(&resultType.name);
    kj::StringTree::~StringTree(&genericParamType.name);
    kj::StringTree::~StringTree(&defineText);
    kj::StringTree::~StringTree(&declareText);
    kj::Array<char>::~Array(&implicitParamsTemplateDecl.content);
    kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&implicitParams);
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName>::~ArrayBuilder
              ((ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> *)&superclasses);
    kj::Array<char>::~Array(&identifierName.content);
    kj::Array<char>::~Array(&titleCase.content);
    sVar1 = templates.content.size_;
    kj::StringTree::StringTree((StringTree *)templates.content.size_,(StringTree *)&typeName);
    kj::StringTree::StringTree((StringTree *)(sVar1 + 0x38),(StringTree *)&typeName.isArgDependent);
    kj::StringTree::StringTree((StringTree *)(sVar1 + 0x70),&local_1d0);
    kj::StringTree::StringTree((StringTree *)(sVar1 + 0xa8),&local_198);
    kj::StringTree::StringTree((StringTree *)(sVar1 + 0xe0),&local_160);
    templates.content.size_ = sVar1 + 0x118;
    MethodText::~MethodText((MethodText *)&typeName);
    uVar30 = local_c78.index + 1;
  }
  methods.size_ = (long)(templates.content.size_ - (long)templates.content.ptr) / 0x118;
  methods.ptr = (MethodText *)templates.content.ptr;
  methods.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  templates.content.ptr = (char *)0x0;
  templates.content.size_ = 0;
  templates.content.disposer = (ArrayDisposer *)0x0;
  kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::~ArrayBuilder
            ((ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText> *)&templates);
  Schema::getProto(&proto,&schema_local.super_Schema);
  if (proto._reader.dataSize < 0x40) {
    uVar27 = 0;
  }
  else {
    uVar27 = *proto._reader.data;
  }
  kj::hex(&hexId,uVar27);
  InterfaceSchema::getSuperclasses((SuperclassList *)&param,&schema_local);
  clientName.name.branches.ptr = (Branch *)param._reader._32_8_;
  clientName.name.branches.size_ = param._reader._40_8_;
  clientName.name.text.content.size_ = (size_t)param._reader.data;
  clientName.name.text.content.disposer = (ArrayDisposer *)param._reader.pointers;
  clientName.name.size_ = (size_t)param._reader.segment;
  clientName.name.text.content.ptr = (char *)param._reader.capTable;
  kj::heapArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>
            ((ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)&builder_1,
             param._reader._32_8_ & 0xffffffff);
  declareText.size_ = (size_t)&clientName;
  for (declareText.text.content.ptr._0_4_ = 0;
      (int)declareText.text.content.ptr != (int)clientName.name.branches.ptr;
      declareText.text.content.ptr._0_4_ = (int)declareText.text.content.ptr + 1) {
    defineText.size_ =
         (size_t)_::
                 IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                 ::operator*((IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                              *)&declareText);
    brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
    cppFullName(&typeName,this,(Schema)defineText.size_,
                (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
    Schema::getProto((Reader *)&builder_3,(Schema *)&defineText);
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::
    add<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>
              ((ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)&builder_1,
               (ExtendInfo *)&typeName);
    kj::StringTree::~StringTree((StringTree *)&typeName);
  }
  superclasses.size_ = ((long)builder_1.pos - (long)builder_1.ptr) / 0x48;
  superclasses.ptr = (ExtendInfo *)builder_1.ptr;
  superclasses.disposer = builder_1.disposer;
  builder_1.ptr = (StringTree *)0x0;
  builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
  builder_1.endPtr = (StringTree *)0x0;
  kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~ArrayBuilder
            ((ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)&builder_1);
  transitiveSuperclasses.disposer = (ArrayDisposer *)0x0;
  param._reader.capTable = (CapTableReader *)((ulong)param._reader.capTable & 0xffffffff00000000);
  param._reader.data = (void *)0x0;
  transitiveSuperclasses.ptr = (ExtendInfo *)0x0;
  transitiveSuperclasses.size_ = 0;
  param._reader.pointers = (WirePointer *)&param._reader.capTable;
  param._reader.nestingLimit = 0;
  param._reader._44_4_ = 0;
  param._reader._32_8_ = param._reader.pointers;
  getTransitiveSuperclasses
            ((CapnpcCppMain *)schema_local.super_Schema.raw,(InterfaceSchema)&param,map);
  Schema::getProto((Reader *)&brandInitializers,&schema_local.super_Schema);
  if ((uint)brandInitializers.scopes.branches.ptr < 0x40) {
    typeName.name.size_ = 0;
  }
  else {
    typeName.name.size_ = *(size_t *)brandInitializers.scopes.text.content.size_;
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
           *)&param,(key_type *)&typeName);
  kj::heapArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>
            (&builder_3,param._reader._40_8_);
  for (p_Var13 = (_Rb_tree_node_base *)param._reader.pointers; pAVar6 = builder_3.disposer,
      pEVar19 = builder_3.ptr, p_Var13 != (_Rb_tree_node_base *)&param._reader.capTable;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
    cppFullName(&typeName,this,(RawBrandedSchema *)p_Var13[1]._M_parent,
                (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
    Schema::getProto((Reader *)&clientName,(Schema *)&p_Var13[1]._M_parent);
    kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::
    add<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>(&builder_3,(ExtendInfo *)&typeName)
    ;
    kj::StringTree::~StringTree((StringTree *)&typeName);
  }
  pRVar14 = (RemoveConst<kj::StringTree> *)(((long)builder_3.pos - (long)builder_3.ptr) / 0x48);
  builder_1.ptr = (StringTree *)builder_3.ptr;
  builder_1.endPtr = (StringTree *)builder_3.disposer;
  builder_3.ptr = (ExtendInfo *)0x0;
  builder_3.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
  builder_3.endPtr = (ExtendInfo *)0x0;
  builder_1.pos = pRVar14;
  kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~ArrayBuilder
            (&builder_3);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::dispose
            (&transitiveSuperclasses);
  transitiveSuperclasses.ptr = pEVar19;
  transitiveSuperclasses.disposer = pAVar6;
  builder_1.ptr = (StringTree *)0x0;
  builder_1.pos = (RemoveConst<kj::StringTree> *)0x0;
  transitiveSuperclasses.size_ = (size_t)pRVar14;
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array
            ((Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)&builder_1);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::InterfaceSchema>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
               *)&param);
  local_78.ptr.isSet = false;
  cppFullName(&typeName,this,schema_local.super_Schema.raw,&local_78);
  CppTypeName::CppTypeName(&clientName,&typeName);
  innerName_05.content.size_ = 7;
  innerName_05.content.ptr = "Client";
  CppTypeName::addMemberType(&clientName,innerName_05);
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  pBVar17 = (BrandInitializerText *)&templates;
  kj::_::concat<kj::StringTree>((String *)pBVar17,(_ *)&brandInitializers,params);
  kj::StringTree::~StringTree(&brandInitializers.scopes);
  uVar34 = 0x18d83f;
  uVar35 = 0;
  kj::strTree<char_const(&)[79],kj::CappedArray<char,17ul>&,char_const(&)[3]>
            (&declareText,
             (kj *)
             "  #if !CAPNP_LITE\n  struct _capnpPrivate {\n    CAPNP_DECLARE_INTERFACE_HEADER(",
             (char (*) [79])&hexId,(CappedArray<char,_17UL> *)")\n",(char (*) [3])pSVar26);
  pSVar26 = (StringTree *)0x240546;
  kj::
  strTree<char_const(&)[4],kj::String&,char_const(&)[2],char_const(&)[17],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
            (&defineText,(kj *)"// ",(char (*) [4])&fullName,(String *)0x240546,
             (char (*) [2])0x23fcc4,(char (*) [17])pBVar17,(String *)"constexpr ::capnp::Kind ",
             (char (*) [25])&fullName,(String *)"::_capnpPrivate::kind;\n",(char (*) [24])pBVar17,
             (String *)"constexpr ::capnp::_::RawSchema const* ",(char (*) [40])&fullName,
             (String *)"::_capnpPrivate::schema;\n",(char (*) [26])CONCAT44(uVar35,uVar34));
  if ((*(uint *)(nestedTypeDecls.size_ + 0x38) < 0x121) ||
     ((*(byte *)(*(long *)(nestedTypeDecls.size_ + 0x28) + 0x24) & 1) == 0)) {
    kj::strTree<kj::StringTree,char_const(&)[100]>
              (&brandInitializers.scopes,(kj *)&declareText,
               (StringTree *)
               "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n"
               ,(char (*) [100])pSVar26);
    kj::StringTree::operator=(&declareText,&brandInitializers.scopes);
    kj::StringTree::~StringTree(&brandInitializers.scopes);
  }
  else {
    params_1 = schema_local.super_Schema.raw;
    makeBrandInitializers
              (&brandInitializers,this,(TemplateContext *)nestedTypeDecls.size_,
               schema_local.super_Schema.raw);
    makeGenericDeclarations
              ((StringTree *)&builder_3,(CapnpcCppMain *)nestedTypeDecls.size_,
               (TemplateContext *)(ulong)(brandInitializers.dependencies.size_ != 0),
               SUB81(params_1.raw,0));
    kj::StringTree::concat<kj::StringTree,kj::StringTree>
              ((StringTree *)&param,&declareText,(StringTree *)&builder_3,(StringTree *)params_1.raw
              );
    kj::StringTree::operator=(&declareText,(StringTree *)&param);
    kj::StringTree::~StringTree((StringTree *)&param);
    kj::StringTree::~StringTree((StringTree *)&builder_3);
    sVar1 = fullName.content.size_;
    templateContext_00 = (TemplateContext *)fullName.content.ptr;
    kj::str<kj::CappedArray<char,17ul>&>((String *)&builder_1,(kj *)&hexId,params_00);
    if (sVar1 == 0) {
      templateContext_00 = (TemplateContext *)0x240547;
    }
    local_828 = (StringTree *)0x240547;
    if (builder_1.pos != (RemoveConst<kj::StringTree> *)0x0) {
      local_828 = builder_1.ptr;
    }
    lStack_820 = (long)&(builder_1.pos)->size_ +
                 (ulong)(builder_1.pos == (RemoveConst<kj::StringTree> *)0x0);
    BrandInitializerText::BrandInitializerText(&local_128,&brandInitializers);
    uVar34 = (undefined4)lStack_820;
    uVar35 = (undefined4)((ulong)lStack_820 >> 0x20);
    hexId_00.content.size_._0_4_ = uVar34;
    hexId_00.content.ptr = (char *)local_828;
    hexId_00.content.size_._4_4_ = uVar35;
    fullName_00.content.size_ = (size_t)&local_128;
    fullName_00.content.ptr = (char *)(sVar1 + (sVar1 == 0));
    makeGenericDefinitions
              ((StringTree *)&builder_3,(CapnpcCppMain *)nestedTypeDecls.size_,templateContext_00,
               fullName_00,hexId_00,pBVar17);
    pSVar26 = (StringTree *)CONCAT44(uVar35,uVar34);
    kj::StringTree::concat<kj::StringTree,kj::StringTree>
              ((StringTree *)&param,&defineText,(StringTree *)&builder_3,pSVar26);
    kj::StringTree::operator=(&defineText,(StringTree *)&param);
    kj::StringTree::~StringTree((StringTree *)&param);
    kj::StringTree::~StringTree((StringTree *)&builder_3);
    BrandInitializerText::~BrandInitializerText(&local_128);
    kj::Array<char>::~Array((Array<char> *)&builder_1);
    BrandInitializerText::~BrandInitializerText(&brandInitializers);
  }
  kj::strTree<kj::StringTree,char_const(&)[30]>
            (&brandInitializers.scopes,(kj *)&declareText,
             (StringTree *)"  };\n  #endif  // !CAPNP_LITE",(char (*) [30])pSVar26);
  kj::StringTree::operator=(&declareText,&brandInitializers.scopes);
  kj::StringTree::~StringTree(&brandInitializers.scopes);
  kj::strTree<kj::StringTree,char_const(&)[25]>
            (&brandInitializers.scopes,(kj *)&defineText,(StringTree *)0x2407ba,
             (char (*) [25])pSVar26);
  kj::StringTree::operator=(&defineText,&brandInitializers.scopes);
  kj::StringTree::~StringTree(&brandInitializers.scopes);
  bVar32 = TemplateContext::hasParams((TemplateContext *)nestedTypeDecls.size_);
  local_d68 = "";
  if (bVar32) {
    local_d68 = "  ";
  }
  suffix_00.content.size_ = 1;
  suffix_00.content.ptr = "";
  TemplateContext::decl
            (&genericParamType.name,(TemplateContext *)nestedTypeDecls.size_,true,suffix_00);
  kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
            (&__return_storage_ptr__->outerTypeDecl,(kj *)&local_d68,(char **)&genericParamType,
             (StringTree *)"  struct ",(char (*) [10])&name_local,(StringPtr *)0x24115c,
             (char (*) [3])this);
  TemplateContext::parentDecls(&resultType.name,(TemplateContext *)nestedTypeDecls.size_);
  suffix_01.content.size_ = 1;
  suffix_01.content.ptr = "";
  TemplateContext::decl
            (&genericResultType.name,(TemplateContext *)nestedTypeDecls.size_,
             scope_local.content.size_ < 2,suffix_01);
  pSVar26 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>
                      ((size_t)((nestedTypeDecls.ptr)->text).content.ptr);
  param._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
  sVar1 = (nestedTypeDecls.ptr)->size_;
  sVar15 = sVar1;
  for (lVar29 = 0; pSVar16 = (StringTree *)(sVar1 + lVar29),
      pSVar16 != (StringTree *)((long)((nestedTypeDecls.ptr)->text).content.ptr * 0x38 + sVar15);
      lVar29 = lVar29 + 0x38) {
    kj::StringTree::StringTree(&brandInitializers.scopes,pSVar16);
    kj::StringTree::StringTree
              ((StringTree *)((long)&pSVar26->size_ + lVar29),&brandInitializers.scopes);
    param._reader.capTable = (CapTableReader *)((long)&pSVar26[1].size_ + lVar29);
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    sVar15 = (nestedTypeDecls.ptr)->size_;
  }
  local_f20.size_ = lVar29 / 0x38;
  local_f20.ptr = pSVar26;
  local_f20.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  param._reader.segment = (SegmentReader *)0x0;
  param._reader.capTable = (CapTableReader *)0x0;
  param._reader.data = (void *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&param);
  params_2 = &scope_local;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[87],kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[6]>
            (&__return_storage_ptr__->outerTypeDef,(kj *)&resultType,&genericResultType.name,
             (StringTree *)0x2403ce,(char (*) [8])params_2,&name_local,(StringPtr *)0x240ef8,
             (char (*) [4])0x23fc44,(char (*) [3])&name_local,
             (StringPtr *)
             "() = delete;\n\n#if !CAPNP_LITE\n  class Client;\n  class Server;\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [87])&local_f20,(Array<kj::StringTree> *)0x240546,(char (*) [2])&declareText
             ,(StringTree *)0x241936,(char (*) [6])this);
  TemplateContext::allDecls(&requestMethodImpl,(TemplateContext *)nestedTypeDecls.size_);
  local_e50._16_8_ = superclasses.size_;
  builder_3.ptr =
       (ExtendInfo *)
       kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(superclasses.size_);
  pEVar19 = superclasses.ptr;
  uVar4 = local_e50._16_8_;
  builder_3.endPtr = (ExtendInfo *)(&((builder_3.ptr)->typeName).name + local_e50._16_8_);
  builder_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar24 = superclasses.ptr;
  builder_3.pos = builder_3.ptr;
  for (lVar29 = local_e50._16_8_ * 0x48; lVar29 != 0; lVar29 = lVar29 + -0x48) {
    CppTypeName::strNoTypename(&brandInitializers.scopes,&pEVar24->typeName);
    kj::strTree<char_const(&)[24],kj::StringTree,char_const(&)[9]>
              ((StringTree *)&param,(kj *)",\n      public virtual ",
               (char (*) [24])&brandInitializers,(StringTree *)0x24202b,(char (*) [9])params_2);
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    kj::StringTree::StringTree((StringTree *)builder_3.pos,(StringTree *)&param);
    builder_3.pos =
         (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
         &((builder_3.pos)->typeName).isArgDependent;
    kj::StringTree::~StringTree((StringTree *)&param);
    pEVar24 = pEVar24 + 1;
  }
  local_ee8._8_8_ = ((long)builder_3.pos - (long)builder_3.ptr) / 0x38;
  local_ee8._0_8_ = builder_3.ptr;
  local_ee8._16_8_ = builder_3.disposer;
  builder_3.ptr = (ExtendInfo *)0x0;
  builder_3.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
  builder_3.endPtr = (ExtendInfo *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&builder_3);
  local_258.ptr = (char *)0x0;
  local_258.size_ = 0;
  local_258.disposer = (ArrayDisposer *)0x0;
  type.content.size_ = (size_t)&local_258;
  type.content.ptr = (char *)name_local.content.size_;
  params_2_00 = (char (*) [9])name_local.content.size_;
  makeAsGenericDef((StringTree *)local_a78,(CapnpcCppMain *)0x2,(AsGenericRole)nestedTypeDecls.size_
                   ,(TemplateContext *)name_local.content.ptr,type,(String *)this);
  local_1060 = (ExtendInfo *)methods.size_;
  pSVar26 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(methods.size_);
  param._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
  lVar31 = (long)local_1060 * 0x118;
  lVar28 = 0;
  pMVar20 = methods.ptr;
  local_1068 = (ExtendInfo *)pSVar26;
  for (lVar29 = 0; lVar31 - lVar29 != 0; lVar29 = lVar29 + 0x118) {
    psVar2 = (size_t *)&local_1068->typeName;
    kj::StringTree::StringTree
              (&brandInitializers.scopes,
               (StringTree *)((long)&(pMVar20->clientDecls).size_ + lVar29));
    kj::StringTree::StringTree((StringTree *)((long)psVar2 + lVar28),&brandInitializers.scopes);
    param._reader.capTable = (CapTableReader *)((long)&pSVar26[1].size_ + lVar28);
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    lVar28 = lVar28 + 0x38;
  }
  titleCase.content.size_ = lVar28 / 0x38;
  titleCase.content.ptr = (char *)local_1068;
  titleCase.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  param._reader.segment = (SegmentReader *)0x0;
  param._reader.capTable = (CapTableReader *)0x0;
  param._reader.data = (void *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&param);
  TemplateContext::allDecls((StringTree *)local_2c8,(TemplateContext *)nestedTypeDecls.size_);
  uVar5 = local_e50._16_8_;
  builder_3.ptr =
       (ExtendInfo *)
       kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(local_e50._16_8_);
  builder_3.endPtr = (ExtendInfo *)(&((builder_3.ptr)->typeName).name + uVar4);
  builder_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  builder_3.pos = builder_3.ptr;
  for (lVar29 = uVar5 * 0x48; lVar29 != 0; lVar29 = lVar29 + -0x48) {
    CppTypeName::strNoTypename(&brandInitializers.scopes,&pEVar19->typeName);
    kj::strTree<char_const(&)[24],kj::StringTree,char_const(&)[9]>
              ((StringTree *)&param,(kj *)",\n      public virtual ",
               (char (*) [24])&brandInitializers,(StringTree *)0x2422a4,params_2_00);
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    kj::StringTree::StringTree((StringTree *)builder_3.pos,(StringTree *)&param);
    builder_3.pos =
         (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)
         &((builder_3.pos)->typeName).isArgDependent;
    kj::StringTree::~StringTree((StringTree *)&param);
    pEVar19 = pEVar19 + 1;
  }
  identifierName.content.size_ = ((long)builder_3.pos - (long)builder_3.ptr) / 0x38;
  identifierName.content.ptr = (char *)builder_3.ptr;
  identifierName.content.disposer = builder_3.disposer;
  builder_3.ptr = (ExtendInfo *)0x0;
  builder_3.pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo> *)0x0;
  builder_3.endPtr = (ExtendInfo *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&builder_3);
  pSVar26 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>((size_t)local_1060);
  param._reader.data = pSVar26 + (long)local_1060;
  param._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
  pEVar19 = local_1060;
  pMVar22 = pMVar20;
  param._reader.segment = (SegmentReader *)pSVar26;
  param._reader.capTable = (CapTableReader *)pSVar26;
  for (; pMVar20 != pMVar22 + (long)pEVar19; pMVar20 = pMVar20 + 1) {
    kj::StringTree::StringTree(&brandInitializers.scopes,&pMVar20->serverDecls);
    pCVar3 = param._reader.capTable;
    kj::StringTree::StringTree((StringTree *)param._reader.capTable,&brandInitializers.scopes);
    pSVar26 = (StringTree *)(pCVar3 + 7);
    param._reader.capTable = (CapTableReader *)pSVar26;
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    pEVar19 = (ExtendInfo *)methods.size_;
    pMVar22 = methods.ptr;
  }
  implicitParams.size_ = ((long)pSVar26 - (long)param._reader.segment) / 0x38;
  implicitParams.ptr = (CppTypeName *)param._reader.segment;
  implicitParams.disposer = (ArrayDisposer *)param._reader.pointers;
  param._reader.segment = (SegmentReader *)0x0;
  param._reader.capTable = (CapTableReader *)0x0;
  param._reader.data = (void *)0x0;
  local_1060 = pEVar19;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&param);
  local_d40._0_16_ = kj::toCharSequence<char_const(&)[17]>((char (*) [17])0x23fcc4);
  local_b10 = kj::toCharSequence<char_const(&)[7]>((char (*) [7])0x2401d4);
  local_868.content.size_ = 0;
  if (fullName.content.size_ != 0) {
    local_868.content.size_ = fullName.content.size_ - 1;
  }
  local_930 = kj::toCharSequence<char_const(&)[58]>
                        ((char (*) [58])"::Client\n    : public virtual ::capnp::Capability::Client"
                        );
  kj::operator*(&brandInitializers,local_ee8);
  paramProto._reader._0_16_ = kj::toCharSequence<char_const(&)[22]>((char (*) [22])0x241d45);
  resultProto._reader.capTable = (CapTableReader *)(name_local.content.size_ - 1);
  resultProto._reader.segment = (SegmentReader *)name_local.content.ptr;
  interfaceProto._reader._0_16_ =
       kj::toCharSequence<char_const(&)[19]>((char (*) [19])" Calls;\n  typedef ");
  implicitParamsTemplateDecl.content.size_ = name_local.content.size_ - 1;
  implicitParamsTemplateDecl.content.ptr = name_local.content.ptr;
  shortParamType.content._0_16_ =
       kj::toCharSequence<char_const(&)[517]>
                 ((char (*) [517])
                  " Reads;\n\n  Client(decltype(nullptr));\n  explicit Client(::kj::Own< ::capnp::ClientHook>&& hook);\n  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Server*>()>>\n  Client(::kj::Own<_t>&& server);\n  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Client*>()>>\n  Client(::kj::Promise<_t>&& promise);\n  Client(::kj::Exception&& exception);\n  Client(Client&) = default;\n  Client(Client&&) = default;\n  Client& operator=(Client& other);\n  Client& operator=(Client&& other);\n\n"
                 );
  kj::operator*((StringTree *)&param,&titleCase);
  shortResultType.content._0_16_ =
       kj::toCharSequence<char_const(&)[39]>
                 ((char (*) [39])"\nprotected:\n  Client() = default;\n};\n\n");
  local_1058 = (undefined1  [16])kj::toCharSequence<char_const(&)[7]>((char (*) [7])0x2401d4);
  local_f78._0_8_ = fullName.content.size_;
  if (fullName.content.size_ != 0) {
    local_f78._0_8_ = fullName.content.ptr;
  }
  local_f78._8_8_ = 0;
  if (fullName.content.size_ != 0) {
    local_f78._8_8_ = fullName.content.size_ - 1;
  }
  local_f88 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[58]>
                        ((char (*) [58])"::Server\n    : public virtual ::capnp::Capability::Server"
                        );
  kj::operator*(&builder_3,&identifierName);
  local_f98 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[12]>((char (*) [12])" {\npublic:\n");
  local_fa8 = kj::toCharSequence<char_const(&)[11]>((char (*) [11])0x241d50);
  local_fb8._8_8_ = name_local.content.size_ - 1;
  local_fb8._0_8_ = name_local.content.ptr;
  local_ec0 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[194]>
                        ((char (*) [194])
                         " Serves;\n\n  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n      override;\n\nprotected:\n"
                        );
  kj::operator*(&builder_1,&implicitParams);
  local_ed0 = (undefined1  [16])kj::toCharSequence<char_const(&)[11]>((char (*) [11])0x24074a);
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_ab0,(kj *)&clientName,local_ed0._8_8_);
  local_e50._0_16_ =
       (undefined1  [16])
       kj::toCharSequence<char_const(&)[89]>
                 ((char (*) [89])
                  " thisCap() {\n    return ::capnp::Capability::Server::thisCap()\n        .template castAs<"
                 );
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_bd0,(kj *)&typeName,local_e50._8_8_);
  local_e60 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[180]>
                        ((char (*) [180])
                         ">();\n  }\n\n  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n};\n#endif  // !CAPNP_LITE\n\n"
                        );
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (&__return_storage_ptr__->clientServerDefs,&local_d40,
             (ArrayPtr<const_char> *)&requestMethodImpl,(StringTree *)&local_b10,
             (ArrayPtr<const_char> *)&local_868,&local_930,
             (ArrayPtr<const_char> *)&brandInitializers,(StringTree *)&paramProto,
             (ArrayPtr<const_char> *)&resultProto,(ArrayPtr<const_char> *)&interfaceProto,
             (ArrayPtr<const_char> *)&implicitParamsTemplateDecl,
             (ArrayPtr<const_char> *)&shortParamType,(ArrayPtr<const_char> *)local_a78,
             (StringTree *)&param,(StringTree *)&shortResultType,(ArrayPtr<const_char> *)local_2c8,
             (StringTree *)local_1058,(ArrayPtr<const_char> *)local_f78,
             (ArrayPtr<const_char> *)local_f88,(ArrayPtr<const_char> *)&builder_3,
             (StringTree *)local_f98,&local_fa8,(ArrayPtr<const_char> *)local_fb8,
             (ArrayPtr<const_char> *)local_ec0,(ArrayPtr<const_char> *)&builder_1,
             (StringTree *)local_ed0,(ArrayPtr<const_char> *)&local_ab0,(String *)local_e50,
             (ArrayPtr<const_char> *)&local_bd0,(String *)local_e60,(ArrayPtr<const_char> *)pMVar22)
  ;
  kj::Array<char>::~Array((Array<char> *)&local_bd0);
  kj::Array<char>::~Array((Array<char> *)&local_ab0);
  kj::StringTree::~StringTree((StringTree *)&builder_1);
  kj::StringTree::~StringTree((StringTree *)&builder_3);
  kj::StringTree::~StringTree((StringTree *)&param);
  kj::StringTree::~StringTree(&brandInitializers.scopes);
  TemplateContext::allDecls((StringTree *)&builder_3,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls((StringTree *)&builder_1,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_ab0,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_bd0,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls(&local_d40,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls((StringTree *)&local_b10,(TemplateContext *)nestedTypeDecls.size_);
  TemplateContext::allDecls((StringTree *)&local_868,(TemplateContext *)nestedTypeDecls.size_);
  pSVar26 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>((size_t)local_1060);
  local_1068 = (ExtendInfo *)&__return_storage_ptr__->inlineMethodDefs;
  param._reader.data = pSVar26 + (long)local_1060;
  param._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
  pMVar20 = pMVar22;
  pEVar19 = local_1060;
  pMVar36 = pMVar22;
  param._reader.segment = (SegmentReader *)pSVar26;
  param._reader.capTable = (CapTableReader *)pSVar26;
  for (; pMVar22 != pMVar20 + (long)pEVar19; pMVar22 = pMVar22 + 1) {
    kj::StringTree::StringTree(&brandInitializers.scopes,&pMVar22->inlineDefs);
    pCVar3 = param._reader.capTable;
    kj::StringTree::StringTree((StringTree *)param._reader.capTable,&brandInitializers.scopes);
    pSVar26 = (StringTree *)(pCVar3 + 7);
    param._reader.capTable = (CapTableReader *)pSVar26;
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    pMVar20 = methods.ptr;
    pEVar19 = (ExtendInfo *)methods.size_;
  }
  implicitParamsTemplateDecl.content.size_ = ((long)pSVar26 - (long)param._reader.segment) / 0x38;
  implicitParamsTemplateDecl.content.ptr = (char *)param._reader.segment;
  implicitParamsTemplateDecl.content.disposer = (ArrayDisposer *)param._reader.pointers;
  param._reader.segment = (SegmentReader *)0x0;
  param._reader.capTable = (CapTableReader *)0x0;
  param._reader.data = (void *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&param);
  paramProto._reader._0_16_ = kj::toCharSequence<char_const(&)[17]>((char (*) [17])0x23fcc4);
  resultProto._reader._0_16_ = kj::toCharSequence<char_const(&)[8]>((char (*) [8])0x242570);
  interfaceProto._reader.segment = (SegmentReader *)fullName.content.size_;
  if (fullName.content.size_ != 0) {
    interfaceProto._reader.segment = (SegmentReader *)fullName.content.ptr;
  }
  interfaceProto._reader.capTable = (CapTableReader *)0x0;
  if (fullName.content.size_ != 0) {
    interfaceProto._reader.capTable = (CapTableReader *)(fullName.content.size_ - 1);
  }
  shortParamType.content._0_16_ =
       kj::toCharSequence<char_const(&)[83]>
                 ((char (*) [83])
                  "::Client::Client(decltype(nullptr))\n    : ::capnp::Capability::Client(nullptr) {}\n"
                 );
  shortResultType.content._0_16_ = kj::toCharSequence<char_const(&)[8]>((char (*) [8])0x242570);
  local_1058._0_8_ = fullName.content.size_;
  if (fullName.content.size_ != 0) {
    local_1058._0_8_ = fullName.content.ptr;
  }
  local_1058._8_8_ = 0;
  if (fullName.content.size_ != 0) {
    local_1058._8_8_ = fullName.content.size_ - 1;
  }
  local_f78 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[116]>
                        ((char (*) [116])
                         "::Client::Client(\n    ::kj::Own< ::capnp::ClientHook>&& hook)\n    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n"
                        );
  local_f88 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[41]>
                        ((char (*) [41])"template <typename _t, typename>\ninline ");
  local_f98._0_8_ = fullName.content.size_;
  if (fullName.content.size_ != 0) {
    local_f98._0_8_ = fullName.content.ptr;
  }
  local_f98._8_8_ = 0;
  if (fullName.content.size_ != 0) {
    local_f98._8_8_ = fullName.content.size_ - 1;
  }
  local_fa8 = kj::toCharSequence<char_const(&)[97]>
                        ((char (*) [97])
                         "::Client::Client(::kj::Own<_t>&& server)\n    : ::capnp::Capability::Client(::kj::mv(server)) {}\n"
                        );
  local_fb8 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[41]>
                        ((char (*) [41])"template <typename _t, typename>\ninline ");
  local_ec0._0_8_ = fullName.content.size_;
  if (fullName.content.size_ != 0) {
    local_ec0._0_8_ = fullName.content.ptr;
  }
  local_ec0._8_8_ = 0;
  if (fullName.content.size_ != 0) {
    local_ec0._8_8_ = fullName.content.size_ - 1;
  }
  local_ed0 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[103]>
                        ((char (*) [103])
                         "::Client::Client(::kj::Promise<_t>&& promise)\n    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n"
                        );
  local_e50._0_16_ = (undefined1  [16])kj::toCharSequence<char_const(&)[8]>((char (*) [8])0x242570);
  local_e60._0_8_ = fullName.content.size_;
  if (fullName.content.size_ != 0) {
    local_e60._0_8_ = fullName.content.ptr;
  }
  local_e60._8_8_ = 0;
  if (fullName.content.size_ != 0) {
    local_e60._8_8_ = fullName.content.size_ - 1;
  }
  local_d50 = (undefined1  [16])
              kj::toCharSequence<char_const(&)[105]>
                        ((char (*) [105])
                         "::Client::Client(::kj::Exception&& exception)\n    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n"
                        );
  local_b68 = (undefined1  [16])kj::toCharSequence<char_const(&)[8]>((char (*) [8])0x242570);
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&param,(kj *)&clientName,local_b68._8_8_);
  local_b78 = (undefined1  [16])kj::toCharSequence<char_const(&)[3]>((char (*) [3])"& ");
  local_b88.currentSize = fullName.content.size_;
  if (fullName.content.size_ != 0) {
    local_b88.currentSize = (size_t)fullName.content.ptr;
  }
  acVar23[0] = '\0';
  acVar23[1] = '\0';
  acVar23[2] = '\0';
  acVar23[3] = '\0';
  acVar23[4] = '\0';
  acVar23[5] = '\0';
  acVar23[6] = '\0';
  acVar23[7] = '\0';
  if (fullName.content.size_ != 0) {
    acVar23 = (char  [8])(fullName.content.size_ - 1);
  }
  local_b88.content[0] = acVar23[0];
  local_b88.content[1] = acVar23[1];
  local_b88.content[2] = acVar23[2];
  local_b88.content[3] = acVar23[3];
  local_b88.content[4] = acVar23[4];
  local_b88.content[5] = acVar23[5];
  local_b88.content[6] = acVar23[6];
  local_b88.content[7] = acVar23[7];
  local_b98 = (CappedArray<char,_8UL>)
              kj::toCharSequence<char_const(&)[105]>
                        ((char (*) [105])
                         "::Client::operator=(Client& other) {\n  ::capnp::Capability::Client::operator=(other);\n  return *this;\n}\n"
                        );
  local_d60 = (undefined1  [16])kj::toCharSequence<char_const(&)[8]>((char (*) [8])0x242570);
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_930,(kj *)&clientName,local_d60._8_8_);
  name_1.content = kj::toCharSequence<char_const(&)[3]>((char (*) [3])"& ");
  local_c78._8_8_ = 0;
  if (fullName.content.size_ != 0) {
    local_c78._8_8_ = fullName.content.size_ - 1;
  }
  _paramSchema = kj::toCharSequence<char_const(&)[115]>
                           ((char (*) [115])
                            "::Client::operator=(Client&& other) {\n  ::capnp::Capability::Client::operator=(kj::mv(other));\n  return *this;\n}\n\n"
                           );
  kj::operator*(&brandInitializers,&implicitParamsTemplateDecl);
  _resultSchema = kj::toCharSequence<char_const(&)[24]>((char (*) [24])0x23fe22);
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            ((StringTree *)local_1068,(StringTree *)&paramProto,(ArrayPtr<const_char> *)&builder_3,
             (StringTree *)&resultProto,(ArrayPtr<const_char> *)&interfaceProto,
             (ArrayPtr<const_char> *)&shortParamType,(ArrayPtr<const_char> *)&builder_1,
             (StringTree *)&shortResultType,(ArrayPtr<const_char> *)local_1058,
             (ArrayPtr<const_char> *)local_f78,(ArrayPtr<const_char> *)&local_ab0,
             (StringTree *)local_f88,(ArrayPtr<const_char> *)local_f98,&local_fa8,
             (ArrayPtr<const_char> *)&local_bd0,(StringTree *)local_fb8,
             (ArrayPtr<const_char> *)local_ec0,(ArrayPtr<const_char> *)local_ed0,
             (ArrayPtr<const_char> *)&local_d40,(StringTree *)local_e50,
             (ArrayPtr<const_char> *)local_e60,(ArrayPtr<const_char> *)local_d50,&local_b10,
             (StringTree *)local_b68,(ArrayPtr<const_char> *)&param,(String *)local_b78,
             (ArrayPtr<const_char> *)&local_b88,(ArrayPtr<const_char> *)&local_b98,
             (ArrayPtr<const_char> *)&local_868,(StringTree *)local_d60,&local_930,(String *)&name_1
             ,(ArrayPtr<const_char> *)&local_c78,(ArrayPtr<const_char> *)&paramSchema,
             (ArrayPtr<const_char> *)&brandInitializers,(StringTree *)&resultSchema,
             (ArrayPtr<const_char> *)pMVar36);
  kj::StringTree::~StringTree(&brandInitializers.scopes);
  kj::Array<char>::~Array((Array<char> *)&local_930);
  kj::Array<char>::~Array((Array<char> *)&param);
  pSVar26 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>((size_t)pEVar19);
  local_e50._16_8_ = &__return_storage_ptr__->sourceDefs;
  param._reader.data = pSVar26 + (long)pEVar19;
  param._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
  pMVar22 = pMVar20;
  param._reader.segment = (SegmentReader *)pSVar26;
  param._reader.capTable = (CapTableReader *)pSVar26;
  for (; pMVar20 != pMVar22 + (long)pEVar19; pMVar20 = pMVar20 + 1) {
    kj::StringTree::StringTree(&brandInitializers.scopes,&pMVar20->sourceDefs);
    pCVar3 = param._reader.capTable;
    kj::StringTree::StringTree((StringTree *)param._reader.capTable,&brandInitializers.scopes);
    pSVar26 = (StringTree *)(pCVar3 + 7);
    param._reader.capTable = (CapTableReader *)pSVar26;
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    pEVar19 = (ExtendInfo *)methods.size_;
    pMVar22 = methods.ptr;
  }
  shortParamType.content.size_ = ((long)pSVar26 - (long)param._reader.segment) / 0x38;
  shortParamType.content.ptr = (char *)param._reader.segment;
  shortParamType.content.disposer = (ArrayDisposer *)param._reader.pointers;
  param._reader.segment = (SegmentReader *)0x0;
  param._reader.capTable = (CapTableReader *)0x0;
  param._reader.data = (void *)0x0;
  local_1060 = pEVar19;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&param);
  TemplateContext::allDecls((StringTree *)&local_930,(TemplateContext *)nestedTypeDecls.size_);
  if (proto._reader.dataSize < 0x40) {
    uVar27 = 0;
  }
  else {
    uVar27 = *proto._reader.data;
  }
  kj::hex((CappedArray<char,_17UL> *)&interfaceProto,uVar27);
  sVar1 = transitiveSuperclasses.size_;
  resultProto._reader.segment =
       (SegmentReader *)
       kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(transitiveSuperclasses.size_)
  ;
  resultProto._reader.data = (void *)((long)resultProto._reader.segment + sVar1 * 0x38);
  resultProto._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
  pEVar19 = transitiveSuperclasses.ptr;
  resultProto._reader.capTable = (CapTableReader *)resultProto._reader.segment;
  for (lVar29 = sVar1 * 0x48; lVar29 != 0; lVar29 = lVar29 + -0x48) {
    kj::hex((CappedArray<char,_17UL> *)&paramProto,pEVar19->id);
    CppTypeName::strNoTypename(&brandInitializers.scopes,&pEVar19->typeName);
    kj::
    strTree<char_const(&)[12],kj::CappedArray<char,17ul>,char_const(&)[19],kj::StringTree,char_const(&)[52]>
              ((StringTree *)&param,(kj *)0x242835,(char (*) [12])&paramProto,
               (CappedArray<char,_17UL> *)"ull:\n      return ",(char (*) [19])&brandInitializers,
               (StringTree *)"::Server::dispatchCallInternal(methodId, context);\n",
               (char (*) [52])pMVar22);
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    kj::StringTree::StringTree((StringTree *)resultProto._reader.capTable,(StringTree *)&param);
    resultProto._reader.capTable = resultProto._reader.capTable + 7;
    kj::StringTree::~StringTree((StringTree *)&param);
    pEVar19 = pEVar19 + 1;
  }
  shortResultType.content.size_ =
       ((long)resultProto._reader.capTable - (long)resultProto._reader.segment) / 0x38;
  shortResultType.content.ptr = (char *)resultProto._reader.segment;
  shortResultType.content.disposer = (ArrayDisposer *)resultProto._reader.pointers;
  resultProto._reader._0_16_ = ZEXT816(0);
  resultProto._reader.data = (void *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&resultProto);
  local_1058 = (undefined1  [16])capnp::schema::Node::Reader::getDisplayName(&proto);
  TemplateContext::allDecls((StringTree *)&param,(TemplateContext *)nestedTypeDecls.size_);
  pEVar19 = local_1060;
  pSVar26 = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>((size_t)local_1060);
  paramProto._reader.data = pSVar26 + (long)pEVar19;
  paramProto._reader.pointers = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
  pMVar20 = pMVar22;
  pMVar36 = pMVar22;
  paramProto._reader.segment = (SegmentReader *)pSVar26;
  paramProto._reader.capTable = (CapTableReader *)pSVar26;
  for (; pMVar22 != pMVar20 + (long)pEVar19; pMVar22 = pMVar22 + 1) {
    kj::StringTree::StringTree(&brandInitializers.scopes,&pMVar22->dispatchCase);
    pCVar3 = paramProto._reader.capTable;
    kj::StringTree::StringTree((StringTree *)paramProto._reader.capTable,&brandInitializers.scopes);
    pSVar26 = (StringTree *)(pCVar3 + 7);
    paramProto._reader.capTable = (CapTableReader *)pSVar26;
    kj::StringTree::~StringTree(&brandInitializers.scopes);
    pMVar20 = methods.ptr;
    pEVar19 = (ExtendInfo *)methods.size_;
  }
  resultProto._reader.capTable =
       (CapTableReader *)(((long)pSVar26 - (long)paramProto._reader.segment) / 0x38);
  resultProto._reader.segment = paramProto._reader.segment;
  resultProto._reader.data = paramProto._reader.pointers;
  paramProto._reader._0_16_ = ZEXT816(0);
  paramProto._reader.data = (void *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose((ArrayBuilder<kj::StringTree> *)&paramProto);
  paramProto._reader._0_16_ = capnp::schema::Node::Reader::getDisplayName(&proto);
  if (proto._reader.dataSize < 0x40) {
    uVar27 = 0;
  }
  else {
    uVar27 = *proto._reader.data;
  }
  kj::hex((CappedArray<char,_17UL> *)&brandInitializers,uVar27);
  kj::
  strTree<char_const(&)[17],kj::Array<kj::StringTree>,kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[185],kj::CappedArray<char,17ul>,char_const(&)[60],kj::Array<kj::StringTree>,char_const(&)[50],capnp::Text::Reader,char_const(&)[24],kj::StringTree,char_const(&)[21],kj::String&,char_const(&)[157],kj::Array<kj::StringTree>,char_const(&)[111],capnp::Text::Reader,char_const(&)[16],kj::CappedArray<char,17ul>,char_const(&)[47],kj::StringTree>
            ((StringTree *)local_e50._16_8_,(kj *)0x23fcc4,(char (*) [17])&shortParamType,
             (Array<kj::StringTree> *)&local_930,(StringTree *)0x242b3e,(char (*) [21])&fullName,
             (String *)
             "::Server::dispatchCall(\n    uint64_t interfaceId, uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (interfaceId) {\n    case 0x"
             ,(char (*) [185])&interfaceProto,
             (CappedArray<char,_17UL> *)
             "ull:\n      return dispatchCallInternal(methodId, context);\n",
             (char (*) [60])&shortResultType,
             (Array<kj::StringTree> *)"    default:\n      return internalUnimplemented(\"",
             (char (*) [50])local_1058,(Reader *)"\", interfaceId);\n  }\n}\n",(char (*) [24])&param
             ,(StringTree *)0x242b3e,(char (*) [21])&fullName,
             (String *)
             "::Server::dispatchCallInternal(\n    uint16_t methodId,\n    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n  switch (methodId) {\n"
             ,(char (*) [157])&resultProto,
             (Array<kj::StringTree> *)
             "    default:\n      (void)context;\n      return ::capnp::Capability::Server::internalUnimplemented(\n          \""
             ,(char (*) [111])&paramProto,(Reader *)"\",\n          0x",
             (char (*) [16])&brandInitializers,
             (CappedArray<char,_17UL> *)"ull, methodId);\n  }\n}\n#endif  // !CAPNP_LITE\n\n",
             (char (*) [47])&defineText,&pMVar36->clientDecls);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&resultProto);
  kj::StringTree::~StringTree((StringTree *)&param);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&shortResultType);
  kj::StringTree::~StringTree((StringTree *)&local_930);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&shortParamType);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&implicitParamsTemplateDecl);
  kj::StringTree::~StringTree((StringTree *)&local_868);
  kj::StringTree::~StringTree((StringTree *)&local_b10);
  kj::StringTree::~StringTree(&local_d40);
  kj::StringTree::~StringTree(&local_bd0);
  kj::StringTree::~StringTree(&local_ab0);
  kj::StringTree::~StringTree((StringTree *)&builder_1);
  kj::StringTree::~StringTree((StringTree *)&builder_3);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&implicitParams);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&identifierName);
  kj::StringTree::~StringTree((StringTree *)local_2c8);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&titleCase);
  kj::StringTree::~StringTree((StringTree *)local_a78);
  kj::Array<char>::~Array(&local_258);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_ee8);
  kj::StringTree::~StringTree(&requestMethodImpl);
  kj::Array<kj::StringTree>::~Array(&local_f20);
  kj::StringTree::~StringTree(&genericResultType.name);
  kj::StringTree::~StringTree(&resultType.name);
  kj::StringTree::~StringTree(&genericParamType.name);
  kj::StringTree::~StringTree(&defineText);
  kj::StringTree::~StringTree(&declareText);
  kj::Array<char>::~Array(&templates.content);
  kj::StringTree::~StringTree(&clientName.name);
  kj::StringTree::~StringTree(&typeName.name);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array
            (&transitiveSuperclasses);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::ExtendInfo>::~Array(&superclasses);
  kj::Array<capnp::(anonymous_namespace)::CapnpcCppMain::MethodText>::~Array(&methods);
  kj::Array<char>::~Array(&fullName.content);
  return __return_storage_ptr__;
}

Assistant:

InterfaceText makeInterfaceText(kj::StringPtr scope, kj::StringPtr name, InterfaceSchema schema,
                                  kj::Array<kj::StringTree> nestedTypeDecls,
                                  const TemplateContext& templateContext) {
    auto fullName = kj::str(scope, name, templateContext.args());
    auto methods = KJ_MAP(m, schema.getMethods()) {
      return makeMethodText(fullName, m, templateContext);
    };

    auto proto = schema.getProto();
    auto hexId = kj::hex(proto.getId());

    auto superclasses = KJ_MAP(superclass, schema.getSuperclasses()) {
      return ExtendInfo { cppFullName(superclass, nullptr), superclass.getProto().getId() };
    };

    kj::Array<ExtendInfo> transitiveSuperclasses;
    {
      std::map<uint64_t, InterfaceSchema> map;
      getTransitiveSuperclasses(schema, map);
      map.erase(schema.getProto().getId());
      transitiveSuperclasses = KJ_MAP(entry, map) {
        return ExtendInfo { cppFullName(entry.second, nullptr), entry.second.getProto().getId() };
      };
    }

    CppTypeName typeName = cppFullName(schema, nullptr);

    CppTypeName clientName = typeName;
    clientName.addMemberType("Client");

    kj::String templates = kj::str(templateContext.allDecls());  // Ends with a newline

    // Private members struct
    kj::StringTree declareText = kj::strTree(
         "  #if !CAPNP_LITE\n"
         "  struct _capnpPrivate {\n"
         "    CAPNP_DECLARE_INTERFACE_HEADER(", hexId, ")\n");

    kj::StringTree defineText = kj::strTree(
        "// ", fullName, "\n",
        "#if !CAPNP_LITE\n",
        templates, "constexpr ::capnp::Kind ", fullName, "::_capnpPrivate::kind;\n",
        templates, "constexpr ::capnp::_::RawSchema const* ", fullName, "::_capnpPrivate::schema;\n");

    if (templateContext.isGeneric()) {
      auto brandInitializers = makeBrandInitializers(templateContext, schema);
      bool hasDeps = (brandInitializers.dependencies.size() != 0);

      declareText = kj::strTree(kj::mv(declareText),
          makeGenericDeclarations(templateContext, hasDeps));

      defineText = kj::strTree(kj::mv(defineText),
          makeGenericDefinitions(
              templateContext, fullName, kj::str(hexId), kj::mv(brandInitializers)));
    } else {
      declareText = kj::strTree(kj::mv(declareText),
        "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n");
    }

    declareText = kj::strTree(kj::mv(declareText), "  };\n  #endif  // !CAPNP_LITE");
    defineText = kj::strTree(kj::mv(defineText), "#endif  // !CAPNP_LITE\n\n");

    return InterfaceText {
      kj::strTree(
          templateContext.hasParams() ? "  " : "", templateContext.decl(true),
          "  struct ", name, ";\n"),

      kj::strTree(
          templateContext.parentDecls(),
          templateContext.decl(scope == nullptr),
          "struct ", scope, name, " {\n",
          "  ", name, "() = delete;\n"
          "\n"
          "#if !CAPNP_LITE\n"
          "  class Client;\n"
          "  class Server;\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          KJ_MAP(n, nestedTypeDecls) { return kj::mv(n); },
          "\n",
          kj::mv(declareText), "\n"
          "};\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "class ", fullName, "::Client\n"
          "    : public virtual ::capnp::Capability::Client",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Client");
          }, " {\n"
          "public:\n"
          "  typedef ", name, " Calls;\n"
          "  typedef ", name, " Reads;\n"
          "\n"
          "  Client(decltype(nullptr));\n"
          "  explicit Client(::kj::Own< ::capnp::ClientHook>&& hook);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Server*>()>>\n"
          "  Client(::kj::Own<_t>&& server);\n"
          "  template <typename _t, typename = ::kj::EnableIf< ::kj::canConvert<_t*, Client*>()>>\n"
          "  Client(::kj::Promise<_t>&& promise);\n"
          "  Client(::kj::Exception&& exception);\n"
          "  Client(Client&) = default;\n"
          "  Client(Client&&) = default;\n"
          "  Client& operator=(Client& other);\n"
          "  Client& operator=(Client&& other);\n"
          "\n",
          makeAsGenericDef(AsGenericRole::CLIENT, templateContext, name),
          KJ_MAP(m, methods) { return kj::mv(m.clientDecls); },
          "\n"
          "protected:\n"
          "  Client() = default;\n"
          "};\n"
          "\n",
          templateContext.allDecls(),
          "class ", fullName, "::Server\n"
          "    : public virtual ::capnp::Capability::Server",
          KJ_MAP(s, superclasses) {
            return kj::strTree(",\n      public virtual ", s.typeName.strNoTypename(), "::Server");
          }, " {\n"
          "public:\n",
          "  typedef ", name, " Serves;\n"
          "\n"
          "  ::kj::Promise<void> dispatchCall(uint64_t interfaceId, uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context)\n"
          "      override;\n"
          "\n"
          "protected:\n",
          KJ_MAP(m, methods) { return kj::mv(m.serverDecls); },
          "\n"
          "  inline ", clientName, " thisCap() {\n"
          "    return ::capnp::Capability::Server::thisCap()\n"
          "        .template castAs<", typeName, ">();\n"
          "  }\n"
          "\n"
          "  ::kj::Promise<void> dispatchCallInternal(uint16_t methodId,\n"
          "      ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context);\n"
          "};\n"
          "#endif  // !CAPNP_LITE\n"
          "\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(decltype(nullptr))\n"
          "    : ::capnp::Capability::Client(nullptr) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(\n"
          "    ::kj::Own< ::capnp::ClientHook>&& hook)\n"
          "    : ::capnp::Capability::Client(::kj::mv(hook)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Own<_t>&& server)\n"
          "    : ::capnp::Capability::Client(::kj::mv(server)) {}\n",
          templateContext.allDecls(),
          "template <typename _t, typename>\n"
          "inline ", fullName, "::Client::Client(::kj::Promise<_t>&& promise)\n"
          "    : ::capnp::Capability::Client(::kj::mv(promise)) {}\n",
          templateContext.allDecls(),
          "inline ", fullName, "::Client::Client(::kj::Exception&& exception)\n"
          "    : ::capnp::Capability::Client(::kj::mv(exception)) {}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client& other) {\n"
          "  ::capnp::Capability::Client::operator=(other);\n"
          "  return *this;\n"
          "}\n",
          templateContext.allDecls(),
          "inline ", clientName, "& ", fullName, "::Client::operator=(Client&& other) {\n"
          "  ::capnp::Capability::Client::operator=(kj::mv(other));\n"
          "  return *this;\n"
          "}\n"
          "\n",
          KJ_MAP(m, methods) { return kj::mv(m.inlineDefs); },
          "#endif  // !CAPNP_LITE\n"),

      kj::strTree(
          "#if !CAPNP_LITE\n",
          KJ_MAP(m, methods) { return kj::mv(m.sourceDefs); },
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCall(\n"
          "    uint64_t interfaceId, uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (interfaceId) {\n"
          "    case 0x", kj::hex(proto.getId()), "ull:\n"
          "      return dispatchCallInternal(methodId, context);\n",
          KJ_MAP(s, transitiveSuperclasses) {
            return kj::strTree(
              "    case 0x", kj::hex(s.id), "ull:\n"
              "      return ", s.typeName.strNoTypename(),
                         "::Server::dispatchCallInternal(methodId, context);\n");
          },
          "    default:\n"
          "      return internalUnimplemented(\"", proto.getDisplayName(), "\", interfaceId);\n"
          "  }\n"
          "}\n",
          templateContext.allDecls(),
          "::kj::Promise<void> ", fullName, "::Server::dispatchCallInternal(\n"
          "    uint16_t methodId,\n"
          "    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {\n"
          "  switch (methodId) {\n",
          KJ_MAP(m, methods) { return kj::mv(m.dispatchCase); },
          "    default:\n"
          "      (void)context;\n"
          "      return ::capnp::Capability::Server::internalUnimplemented(\n"
          "          \"", proto.getDisplayName(), "\",\n"
          "          0x", kj::hex(proto.getId()), "ull, methodId);\n"
          "  }\n"
          "}\n"
          "#endif  // !CAPNP_LITE\n"
          "\n",
          kj::mv(defineText))
    };
  }